

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O3

void drawImage7(Array<Imf_3_2::Rgba> *px,int w,int h,int y)

{
  Rgba *pRVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  float __x;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (0 < w) {
    __x = (float)(y - h / 2);
    uVar5 = 0;
    do {
      fVar6 = (float)(int)((int)uVar5 - ((uint)w >> 1));
      fVar7 = atan2f(fVar6,__x);
      fVar8 = SQRT(fVar6 * fVar6 + __x * __x);
      pRVar1 = px->_data;
      fVar6 = sinf(fVar8 * 0.1);
      fVar6 = sinf(fVar6 * 0.3 + fVar7 * 3.0);
      fVar9 = fVar6 * 0.5 + 0.5;
      fVar6 = ABS(fVar9);
      uVar3 = (ushort)((uint)fVar9 >> 0x10) & 0x8000;
      if ((uint)fVar6 < 0x38800000) {
        if ((0x33000000 < (uint)fVar6) &&
           (uVar4 = (uint)fVar6 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar6 >> 0x17),
           uVar3 = uVar3 | (ushort)(uVar4 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar4 << (cVar2 + 0xa2U & 0x1f))) {
          uVar3 = uVar3 + 1;
        }
      }
      else if ((uint)fVar6 < 0x7f800000) {
        if ((uint)fVar6 < 0x477ff000) {
          uVar3 = (ushort)((int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd) |
                  uVar3;
        }
        else {
          uVar3 = uVar3 | 0x7c00;
        }
      }
      else {
        uVar3 = uVar3 | 0x7c00;
        if (fVar6 != INFINITY) {
          uVar4 = (uint)fVar6 >> 0xd & 0x3ff;
          uVar3 = uVar3 | (ushort)uVar4 | (ushort)(uVar4 == 0);
        }
      }
      pRVar1[uVar5].r._h = uVar3;
      fVar6 = sinf(fVar8 * 0.11);
      fVar6 = sinf(fVar6 * 0.3 + fVar7 * 3.0);
      fVar9 = fVar6 * 0.5 + 0.5;
      fVar6 = ABS(fVar9);
      uVar3 = (ushort)((uint)fVar9 >> 0x10) & 0x8000;
      if ((uint)fVar6 < 0x38800000) {
        if ((0x33000000 < (uint)fVar6) &&
           (uVar4 = (uint)fVar6 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar6 >> 0x17),
           uVar3 = uVar3 | (ushort)(uVar4 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar4 << (cVar2 + 0xa2U & 0x1f))) {
          uVar3 = uVar3 + 1;
        }
      }
      else if ((uint)fVar6 < 0x7f800000) {
        if ((uint)fVar6 < 0x477ff000) {
          uVar3 = (ushort)((int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd) |
                  uVar3;
        }
        else {
          uVar3 = uVar3 | 0x7c00;
        }
      }
      else {
        uVar3 = uVar3 | 0x7c00;
        if (fVar6 != INFINITY) {
          uVar4 = (uint)fVar6 >> 0xd & 0x3ff;
          uVar3 = uVar3 | (ushort)uVar4 | (ushort)(uVar4 == 0);
        }
      }
      pRVar1[uVar5].g._h = uVar3;
      fVar6 = sinf(fVar8 * 0.12);
      fVar6 = sinf(fVar6 * 0.3 + fVar7 * 3.0);
      fVar7 = fVar6 * 0.5 + 0.5;
      fVar6 = ABS(fVar7);
      uVar3 = (ushort)((uint)fVar7 >> 0x10) & 0x8000;
      if ((uint)fVar6 < 0x38800000) {
        if ((0x33000000 < (uint)fVar6) &&
           (uVar4 = (uint)fVar6 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar6 >> 0x17),
           uVar3 = uVar3 | (ushort)(uVar4 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar4 << (cVar2 + 0xa2U & 0x1f))) {
          uVar3 = uVar3 + 1;
        }
      }
      else if ((uint)fVar6 < 0x7f800000) {
        if ((uint)fVar6 < 0x477ff000) {
          uVar3 = (ushort)((int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd) |
                  uVar3;
        }
        else {
          uVar3 = uVar3 | 0x7c00;
        }
      }
      else {
        uVar3 = uVar3 | 0x7c00;
        if (fVar6 != INFINITY) {
          uVar4 = (uint)fVar6 >> 0xd & 0x3ff;
          uVar3 = uVar3 | (ushort)uVar4 | (ushort)(uVar4 == 0);
        }
      }
      pRVar1[uVar5].b._h = uVar3;
      pRVar1[uVar5].a._h = 0x3c00;
      uVar5 = uVar5 + 1;
    } while ((uint)w != uVar5);
  }
  return;
}

Assistant:

void
drawImage7 (Array<Rgba>& px, int w, int h, int y)
{
    for (int x = 0; x < w; ++x)
    {
        float xc = x - w / 2;
        float yc = y - h / 2;
        float a  = atan2 (xc, yc);
        float r  = sqrt (xc * xc + yc * yc);

        Rgba& p = px[x];
        p.r     = sin (3.0f * a + 0.3f * sin (0.10f * r)) * 0.5f + 0.5f;
        p.g     = sin (3.0f * a + 0.3f * sin (0.11f * r)) * 0.5f + 0.5f;
        p.b     = sin (3.0f * a + 0.3f * sin (0.12f * r)) * 0.5f + 0.5f;
        p.a     = 1;
    }
}